

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserFormatter.cpp
# Opt level: O2

void __thiscall
cali::UserFormatter::UserFormatter(UserFormatter *this,OutputStream *os,QuerySpec *spec)

{
  FormatImpl *this_00;
  const_iterator cVar1;
  ostream *poVar2;
  allocator<char> local_49;
  key_type local_48;
  
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__UserFormatter_0028ff30;
  this_00 = (FormatImpl *)operator_new(0x98);
  FormatImpl::FormatImpl(this_00,os);
  std::__shared_ptr<cali::UserFormatter::FormatImpl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cali::UserFormatter::FormatImpl,void>
            ((__shared_ptr<cali::UserFormatter::FormatImpl,(__gnu_cxx::_Lock_policy)2> *)&this->mP,
             this_00);
  FormatImpl::configure
            ((this->mP).
             super___shared_ptr<cali::UserFormatter::FormatImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             spec);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"title",&local_49);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(spec->format).kwargs._M_t,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((_Rb_tree_header *)cVar1._M_node != &(spec->format).kwargs._M_t._M_impl.super__Rb_tree_header)
  {
    poVar2 = OutputStream::stream(os);
    poVar2 = std::operator<<(poVar2,(string *)(cVar1._M_node + 2));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

UserFormatter::UserFormatter(OutputStream& os, const QuerySpec& spec) : mP { new FormatImpl(os) }
{
    mP->configure(spec);

    {
        auto it = spec.format.kwargs.find("title");
        if (it != spec.format.kwargs.end()) {
            std::ostream* real_os = os.stream();
            *real_os << it->second << std::endl;
        }
    }
}